

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

errr finish_parse_lore(parser *p)

{
  ushort uVar1;
  monster_blow *pmVar2;
  wchar_t wVar3;
  monster_race *pmVar4;
  long lVar5;
  ulong uVar6;
  monster_lore *lore;
  monster_race *pmVar7;
  monster_friends *pmVar8;
  
  for (uVar6 = 0; pmVar7 = r_info, uVar6 < z_info->r_max; uVar6 = uVar6 + 1) {
    lore = l_list + uVar6;
    if (r_info[uVar6].base != (monster_base *)0x0) {
      flag_union(lore->flags,(r_info[uVar6].base)->flags,0xc);
    }
    pmVar7 = pmVar7 + uVar6;
    uVar1 = z_info->mon_blows_max;
    lVar5 = 0;
    while (((ulong)uVar1 * 0x30 - lVar5 != 0 &&
           (pmVar2 = pmVar7->blow, pmVar2 != (monster_blow *)0x0))) {
      if ((*(long *)((long)&pmVar2->effect + lVar5) == 0) &&
         (*(long *)((long)&pmVar2->method + lVar5) == 0)) {
        *(undefined4 *)((long)&lore->blows->times_seen + lVar5) = 0;
      }
      lVar5 = lVar5 + 0x30;
    }
    pmVar8 = (monster_friends *)&lore->friends;
    while (pmVar8 = pmVar8->next, pmVar8 != (monster_friends *)0x0) {
      wVar3 = my_stricmp(pmVar8->name,"same");
      pmVar4 = pmVar7;
      if (wVar3 != L'\0') {
        pmVar4 = lookup_monster(pmVar8->name);
      }
      pmVar8->race = pmVar4;
      string_free(pmVar8->name);
    }
    lore_update(pmVar7,lore);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_lore(struct parser *p) {
	size_t i;

	/* Processing */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_lore *l = &l_list[i];
		struct monster_race *r = &r_info[i];
		struct monster_friends *f;
		int j;

		/* Base flag knowledge */
		if (r->base) {
			rf_union(l->flags, r->base->flags);
		}

		/* Remove blows data for non-blows */
		for (j = 0; j < z_info->mon_blows_max; j++) {
			if (!r->blow) break;
			if (!(r->blow[j].effect || r->blow[j].method))
				l->blows[j].times_seen = 0;
		}

		/* Convert friend names into race pointers - failure leaves NULL race */
		for (f = l->friends; f; f = f->next) {
			if (!my_stricmp(f->name, "same"))
				f->race = r;
			else
				f->race = lookup_monster(f->name);

			string_free(f->name);
		}

		/* update any derived values */
		lore_update(r, l);
	}

	parser_destroy(p);
	return 0;
}